

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<std::complex<float>_> * __thiscall
webrtc::Matrix<std::complex<float>_>::Transpose
          (Matrix<std::complex<float>_> *this,Matrix<std::complex<float>_> *operand)

{
  complex<float> **src;
  Matrix<std::complex<float>_> *pMVar1;
  FatalMessage local_318;
  string *local_1a0;
  string *_result_1;
  string *local_20;
  string *_result;
  Matrix<std::complex<float>_> *operand_local;
  Matrix<std::complex<float>_> *this_local;
  
  _result = (string *)operand;
  operand_local = this;
  local_20 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       (&operand->num_rows_,&this->num_columns_,"operand.num_rows_ == num_columns_")
  ;
  if (local_20 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/matrix.h"
               ,0x8c,local_20);
    rtc::FatalMessage::stream((FatalMessage *)&_result_1);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_1);
  }
  local_1a0 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                        ((unsigned_long *)(_result + 0x10),&this->num_rows_,
                         "operand.num_columns_ == num_rows_");
  if (local_1a0 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_318,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/matrix.h"
               ,0x8d,local_1a0);
    rtc::FatalMessage::stream(&local_318);
    rtc::FatalMessage::~FatalMessage(&local_318);
  }
  src = elements((Matrix<std::complex<float>_> *)_result);
  pMVar1 = Transpose(this,src);
  return pMVar1;
}

Assistant:

Matrix& Transpose(const Matrix& operand) {
    RTC_CHECK_EQ(operand.num_rows_, num_columns_);
    RTC_CHECK_EQ(operand.num_columns_, num_rows_);

    return Transpose(operand.elements());
  }